

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O2

string * __thiscall
deqp::gles2::Performance::loopFragmentTemplate_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,LoopType type,bool isVertexCase,
          int numLoopIterations,int nestingDepth)

{
  undefined7 in_register_00000009;
  char *pcVar1;
  int iVar2;
  char *__s;
  int local_1bc;
  int local_1b8;
  int numLoopIterations_local;
  string local_1b0;
  string iterName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string loopBound;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  iVar2 = (int)this;
  numLoopIterations_local = (int)CONCAT71(in_register_00000009,isVertexCase);
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_1b8 = numLoopIterations;
  if (iVar2 == 0) {
    de::toString<int>(&loopBound,&numLoopIterations_local);
  }
  else {
    pcVar1 = "";
    if (iVar2 == 2) {
      pcVar1 = "int(v_loopBound${NAME_SPEC})";
    }
    __s = "int(u_loopBound${NAME_SPEC})";
    if (iVar2 != 1) {
      __s = pcVar1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&loopBound,__s,(allocator<char> *)&iterName);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((char)type == '\0') {
    if ((iVar2 == 1) || (iVar2 == 2)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    for (local_1bc = 0; local_1bc < local_1b8; local_1bc = local_1bc + 1) {
      de::toString<int>(&local_1b0,&local_1bc);
      std::operator+(&iterName,"i",&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_170,(char)local_1bc + '\x01');
      std::operator+(&local_70,&local_170,"for (int ");
      std::operator+(&local_130,&local_70,&iterName);
      std::operator+(&local_50,&local_130," = 0; ");
      std::operator+(&local_110,&local_50,&iterName);
      std::operator+(&local_f0,&local_110," < ");
      std::operator+(&local_d0,&local_f0,&loopBound);
      std::operator+(&local_b0,&local_d0,"; ");
      std::operator+(&local_90,&local_b0,&iterName);
      std::operator+(&local_1b0,&local_90,"++)\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&iterName);
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_1b0,(char)local_1b8 + '\x01');
    std::operator+(&iterName,&local_1b0,"value *= v_value${NAME_SPEC};\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&iterName);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&loopBound);
  return __return_storage_ptr__;
}

Assistant:

static string loopFragmentTemplate (LoopType type, bool isVertexCase, int numLoopIterations, int nestingDepth)
{
	string resultTemplate;
	string loopBound		= type == LOOP_TYPE_STATIC	? de::toString(numLoopIterations)
							: type == LOOP_TYPE_UNIFORM	? "int(u_loopBound${NAME_SPEC})"
							: type == LOOP_TYPE_DYNAMIC	? "int(v_loopBound${NAME_SPEC})"
							: "";

	DE_ASSERT(!loopBound.empty());

	resultTemplate +=
		"varying mediump vec4 v_value${NAME_SPEC};\n";

	if (!isVertexCase)
	{
		if (type == LOOP_TYPE_DYNAMIC)
			resultTemplate +=
				"varying mediump float v_loopBound${NAME_SPEC};\n";
		else if (type == LOOP_TYPE_UNIFORM)
			resultTemplate +=
				"uniform mediump float u_loopBound${NAME_SPEC};\n";

		resultTemplate +=
			"\n"
			"void main()\n"
			"{\n"
			"	mediump vec4 value = v_value${NAME_SPEC};\n";

		for (int i = 0; i < nestingDepth; i++)
		{
			string iterName = "i" + de::toString(i);
			resultTemplate += string(i + 1, '\t') + "for (int " + iterName + " = 0; " + iterName + " < " + loopBound + "; " + iterName + "++)\n";
		}

		resultTemplate += string(nestingDepth + 1, '\t') + "value *= v_value${NAME_SPEC};\n";

		resultTemplate +=
			"	gl_FragColor = value + ${FLOAT01};\n";
	}
	else
		resultTemplate +=
			"\n"
			"void main()\n"
			"{\n"
			"	gl_FragColor = v_value${NAME_SPEC} + ${FLOAT01};\n";

	resultTemplate +=
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}